

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateIsInitialized
          (ImmutableMessageGenerator *this,Printer *printer)

{
  long lVar1;
  ClassNameResolver *pCVar2;
  string *psVar3;
  bool bVar4;
  JavaType JVar5;
  FieldGeneratorInfo *pFVar6;
  Descriptor *pDVar7;
  FieldDescriptor *pFVar8;
  LogMessage *other;
  long lVar9;
  _Alloc_hider _Var10;
  long lVar11;
  string local_b8;
  ClassNameResolver *local_98;
  FieldDescriptor *local_90;
  string local_88;
  LogMessage local_68;
  
  io::Printer::Print<>(printer,"private byte memoizedIsInitialized = -1;\n");
  io::Printer::Print<>(printer,"@java.lang.Override\npublic final boolean isInitialized() {\n");
  io::Printer::Indent(printer);
  io::Printer::Print<>
            (printer,
             "byte isInitialized = memoizedIsInitialized;\nif (isInitialized == 1) return true;\nif (isInitialized == 0) return false;\n\n"
            );
  pDVar7 = (this->super_MessageGenerator).descriptor_;
  if (0 < *(int *)(pDVar7 + 4)) {
    lVar9 = 0;
    lVar11 = 0;
    do {
      lVar1 = *(long *)(pDVar7 + 0x28);
      pFVar6 = Context::GetFieldGeneratorInfo(this->context_,(FieldDescriptor *)(lVar9 + lVar1));
      if ((*(byte *)(lVar1 + 1 + lVar9) & 0x60) == 0x40) {
        io::Printer::Print<char[5],std::__cxx11::string>
                  (printer,"if (!has$name$()) {\n  memoizedIsInitialized = 0;\n  return false;\n}\n"
                   ,(char (*) [5])0x3f58c9,&pFVar6->capitalized_name);
      }
      lVar11 = lVar11 + 1;
      pDVar7 = (this->super_MessageGenerator).descriptor_;
      lVar9 = lVar9 + 0x48;
    } while (lVar11 < *(int *)(pDVar7 + 4));
  }
  pDVar7 = (this->super_MessageGenerator).descriptor_;
  if (0 < *(int *)(pDVar7 + 4)) {
    lVar11 = 0;
    lVar9 = 0;
    do {
      lVar1 = *(long *)(pDVar7 + 0x28);
      pFVar8 = (FieldDescriptor *)(lVar1 + lVar11);
      pFVar6 = Context::GetFieldGeneratorInfo(this->context_,pFVar8);
      JVar5 = GetJavaType(pFVar8);
      if (JVar5 != JAVATYPE_MESSAGE) goto switchD_002cd9e3_caseD_0;
      pDVar7 = FieldDescriptor::message_type(pFVar8);
      bVar4 = HasRequiredFields(pDVar7);
      if (!bVar4) goto switchD_002cd9e3_caseD_0;
      switch(*(byte *)(lVar1 + 1 + lVar11) >> 5 & 3) {
      case 1:
        io::Printer::Print<char[5],std::__cxx11::string>
                  (printer,
                   "if (has$name$()) {\n  if (!get$name$().isInitialized()) {\n    memoizedIsInitialized = 0;\n    return false;\n  }\n}\n"
                   ,(char (*) [5])0x3f58c9,&pFVar6->capitalized_name);
        break;
      case 2:
        pCVar2 = this->name_resolver_;
        pDVar7 = FieldDescriptor::message_type(pFVar8);
        ClassNameResolver::GetClassName_abi_cxx11_(&local_b8,pCVar2,pDVar7,true);
        io::Printer::Print<char[5],std::__cxx11::string,char[5],std::__cxx11::string>
                  (printer,
                   "if (!get$name$().isInitialized()) {\n  memoizedIsInitialized = 0;\n  return false;\n}\n"
                   ,(char (*) [5])0x4448a3,&local_b8,(char (*) [5])0x3f58c9,
                   &pFVar6->capitalized_name);
LAB_002cdbe5:
        psVar3 = &local_b8;
        _Var10._M_p = local_b8._M_dataplus._M_p;
        goto LAB_002cdbef;
      case 3:
        pDVar7 = FieldDescriptor::message_type(pFVar8);
        if (*(char *)(*(long *)(pDVar7 + 0x20) + 0x4b) != '\x01') {
          pCVar2 = this->name_resolver_;
          pDVar7 = FieldDescriptor::message_type(pFVar8);
          ClassNameResolver::GetClassName_abi_cxx11_(&local_b8,pCVar2,pDVar7,true);
          io::Printer::Print<char[5],std::__cxx11::string,char[5],std::__cxx11::string>
                    (printer,
                     "for (int i = 0; i < get$name$Count(); i++) {\n  if (!get$name$(i).isInitialized()) {\n    memoizedIsInitialized = 0;\n    return false;\n  }\n}\n"
                     ,(char (*) [5])0x4448a3,&local_b8,(char (*) [5])0x3f58c9,
                     &pFVar6->capitalized_name);
          goto LAB_002cdbe5;
        }
        pDVar7 = FieldDescriptor::message_type(pFVar8);
        local_98 = this->name_resolver_;
        local_b8.field_2._M_local_buf[4] = 'e';
        local_b8.field_2._M_allocated_capacity._0_4_ = 0x756c6176;
        local_b8._M_string_length = 5;
        local_b8.field_2._M_local_buf[5] = '\0';
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        pFVar8 = Descriptor::FindFieldByName(pDVar7,&local_b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p);
        }
        if (*(once_flag **)(pFVar8 + 0x18) != (once_flag *)0x0) {
          local_b8._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
          local_90 = pFVar8;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(pFVar8 + 0x18),(_func_void_FieldDescriptor_ptr **)&local_b8,
                     &local_90);
        }
        if (pFVar8[2] != (FieldDescriptor)0xb) {
          internal::LogMessage::LogMessage
                    (&local_68,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_message.cc"
                     ,0x47);
          other = internal::LogMessage::operator<<
                            (&local_68,
                             "CHECK failed: (FieldDescriptor::TYPE_MESSAGE) == (value_field->type()): "
                            );
          internal::LogFinisher::operator=((LogFinisher *)&local_b8,other);
          internal::LogMessage::~LogMessage(&local_68);
        }
        pDVar7 = FieldDescriptor::message_type(pFVar8);
        ClassNameResolver::GetClassName_abi_cxx11_(&local_88,local_98,pDVar7,true);
        io::Printer::Print<char[5],std::__cxx11::string,char[5],std::__cxx11::string>
                  (printer,
                   "for ($type$ item : get$name$Map().values()) {\n  if (!item.isInitialized()) {\n    memoizedIsInitialized = 0;\n    return false;\n  }\n}\n"
                   ,(char (*) [5])0x4448a3,&local_88,(char (*) [5])0x3f58c9,
                   &pFVar6->capitalized_name);
        psVar3 = &local_88;
        _Var10._M_p = local_88._M_dataplus._M_p;
LAB_002cdbef:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &psVar3->field_2) {
          operator_delete(_Var10._M_p);
        }
      }
switchD_002cd9e3_caseD_0:
      lVar9 = lVar9 + 1;
      pDVar7 = (this->super_MessageGenerator).descriptor_;
      lVar11 = lVar11 + 0x48;
    } while (lVar9 < *(int *)(pDVar7 + 4));
  }
  if (0 < *(int *)(pDVar7 + 0x78)) {
    io::Printer::Print<>
              (printer,
               "if (!extensionsAreInitialized()) {\n  memoizedIsInitialized = 0;\n  return false;\n}\n"
              );
  }
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"  memoizedIsInitialized = 1;\n");
  io::Printer::Print<>(printer,"  return true;\n}\n\n");
  return;
}

Assistant:

void ImmutableMessageGenerator::GenerateIsInitialized(io::Printer* printer) {
  // Memoizes whether the protocol buffer is fully initialized (has all
  // required fields). -1 means not yet computed. 0 means false and 1 means
  // true.
  printer->Print("private byte memoizedIsInitialized = -1;\n");
  printer->Print(
      "@java.lang.Override\n"
      "public final boolean isInitialized() {\n");
  printer->Indent();

  // Don't directly compare to -1 to avoid an Android x86 JIT bug.
  printer->Print(
      "byte isInitialized = memoizedIsInitialized;\n"
      "if (isInitialized == 1) return true;\n"
      "if (isInitialized == 0) return false;\n"
      "\n");

  // Check that all required fields in this message are set.
  // TODO(kenton):  We can optimize this when we switch to putting all the
  //   "has" fields into a single bitfield.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    const FieldGeneratorInfo* info = context_->GetFieldGeneratorInfo(field);

    if (field->is_required()) {
      printer->Print(
          "if (!has$name$()) {\n"
          "  memoizedIsInitialized = 0;\n"
          "  return false;\n"
          "}\n",
          "name", info->capitalized_name);
    }
  }

  // Now check that all embedded messages are initialized.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    const FieldGeneratorInfo* info = context_->GetFieldGeneratorInfo(field);
    if (GetJavaType(field) == JAVATYPE_MESSAGE &&
        HasRequiredFields(field->message_type())) {
      switch (field->label()) {
        case FieldDescriptor::LABEL_REQUIRED:
          printer->Print(
              "if (!get$name$().isInitialized()) {\n"
              "  memoizedIsInitialized = 0;\n"
              "  return false;\n"
              "}\n",
              "type",
              name_resolver_->GetImmutableClassName(field->message_type()),
              "name", info->capitalized_name);
          break;
        case FieldDescriptor::LABEL_OPTIONAL:
          printer->Print(
              "if (has$name$()) {\n"
              "  if (!get$name$().isInitialized()) {\n"
              "    memoizedIsInitialized = 0;\n"
              "    return false;\n"
              "  }\n"
              "}\n",
              "name", info->capitalized_name);
          break;
        case FieldDescriptor::LABEL_REPEATED:
          if (IsMapEntry(field->message_type())) {
            printer->Print(
                "for ($type$ item : get$name$Map().values()) {\n"
                "  if (!item.isInitialized()) {\n"
                "    memoizedIsInitialized = 0;\n"
                "    return false;\n"
                "  }\n"
                "}\n",
                "type",
                MapValueImmutableClassdName(field->message_type(),
                                            name_resolver_),
                "name", info->capitalized_name);
          } else {
            printer->Print(
                "for (int i = 0; i < get$name$Count(); i++) {\n"
                "  if (!get$name$(i).isInitialized()) {\n"
                "    memoizedIsInitialized = 0;\n"
                "    return false;\n"
                "  }\n"
                "}\n",
                "type",
                name_resolver_->GetImmutableClassName(field->message_type()),
                "name", info->capitalized_name);
          }
          break;
      }
    }
  }

  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
        "if (!extensionsAreInitialized()) {\n"
        "  memoizedIsInitialized = 0;\n"
        "  return false;\n"
        "}\n");
  }

  printer->Outdent();

  printer->Print("  memoizedIsInitialized = 1;\n");

  printer->Print(
      "  return true;\n"
      "}\n"
      "\n");
}